

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O0

void __thiscall TCLAP::Arg::~Arg(Arg *this)

{
  Arg *this_local;
  
  this->_vptr_Arg = (_func_int **)&PTR__Arg_0019f4e0;
  std::__cxx11::string::~string((string *)&this->_requireLabel);
  std::__cxx11::string::~string((string *)&this->_description);
  std::__cxx11::string::~string((string *)&this->_name);
  std::__cxx11::string::~string((string *)&this->_flag);
  return;
}

Assistant:

inline Arg::~Arg() { }